

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QString,long_long&,int&,int&>
          (QMovableArrayOps<QTimeZonePrivate::Data> *this,qsizetype i,QString *args,longlong *args_1
          ,int *args_2,int *args_3)

{
  qsizetype *pqVar1;
  Data **ppDVar2;
  int iVar3;
  int iVar4;
  Data *pDVar5;
  Data *pDVar6;
  longlong lVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  long lVar11;
  Data *pDVar12;
  bool bVar13;
  
  pDVar5 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
           super_QArrayDataPointer<QTimeZonePrivate::Data>.d;
  if ((pDVar5 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
    if ((lVar11 == i) &&
       (pDVar6 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                 super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr,
       (pDVar5->super_QArrayData).alloc - i !=
       ((long)((long)pDVar6 -
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      lVar7 = *args_1;
      iVar3 = *args_2;
      iVar4 = *args_3;
      pDVar8 = (args->d).d;
      pDVar6[i].abbreviation.d.d = pDVar8;
      pDVar6[i].abbreviation.d.ptr = (args->d).ptr;
      pDVar6[i].abbreviation.d.size = (args->d).size;
      lVar11 = i;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                 super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
      }
      pDVar6[i].atMSecsSinceEpoch = lVar7;
      pDVar6[i].offsetFromUtc = iVar3;
      pDVar6[i].standardTimeOffset = iVar4;
      pDVar6[i].daylightTimeOffset = iVar3 - iVar4;
      goto LAB_004028c1;
    }
    if ((i == 0) &&
       (pDVar6 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                 super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr,
       (Data *)((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
       pDVar6)) {
      lVar7 = *args_1;
      iVar3 = *args_2;
      iVar4 = *args_3;
      pDVar8 = (args->d).d;
      pDVar6[-1].abbreviation.d.d = pDVar8;
      pDVar6[-1].abbreviation.d.ptr = (args->d).ptr;
      pDVar6[-1].abbreviation.d.size = (args->d).size;
      pDVar12 = pDVar6;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar12 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                  super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
        lVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                 super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
      }
      pDVar6[-1].atMSecsSinceEpoch = lVar7;
      pDVar6[-1].offsetFromUtc = iVar3;
      pDVar6[-1].standardTimeOffset = iVar4;
      pDVar6[-1].daylightTimeOffset = iVar3 - iVar4;
      (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
      super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr = pDVar12 + -1;
      goto LAB_004028c1;
    }
  }
  lVar7 = *args_1;
  iVar3 = *args_2;
  iVar4 = *args_3;
  pDVar8 = (args->d).d;
  pcVar9 = (args->d).ptr;
  qVar10 = (args->d).size;
  if (pDVar8 != (Data *)0x0) {
    LOCK();
    (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar13 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
           super_QArrayDataPointer<QTimeZonePrivate::Data>.size != 0;
  QArrayDataPointer<QTimeZonePrivate::Data>::detachAndGrow
            ((QArrayDataPointer<QTimeZonePrivate::Data> *)this,(uint)(i == 0 && bVar13),1,
             (Data **)0x0,(QArrayDataPointer<QTimeZonePrivate::Data> *)0x0);
  pqVar1 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
            super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
  pDVar6 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
           super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
  if (i == 0 && bVar13) {
    pDVar6[-1].abbreviation.d.d = pDVar8;
    pDVar6[-1].abbreviation.d.ptr = pcVar9;
    pDVar6[-1].abbreviation.d.size = qVar10;
    pDVar6[-1].atMSecsSinceEpoch = lVar7;
    pDVar6[-1].offsetFromUtc = iVar3;
    pDVar6[-1].standardTimeOffset = iVar4;
    pDVar6[-1].daylightTimeOffset = iVar3 - iVar4;
    ppDVar2 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
               super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
    *ppDVar2 = *ppDVar2 + -1;
    lVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
  }
  else {
    pDVar12 = pDVar6 + i;
    memmove(pDVar12 + 1,pDVar6 + i,(*pqVar1 - i) * 0x30);
    (pDVar12->abbreviation).d.d = pDVar8;
    (pDVar12->abbreviation).d.ptr = pcVar9;
    (pDVar12->abbreviation).d.size = qVar10;
    pDVar12->atMSecsSinceEpoch = lVar7;
    pDVar12->offsetFromUtc = iVar3;
    pDVar12->standardTimeOffset = iVar4;
    pDVar12->daylightTimeOffset = iVar3 - iVar4;
    lVar11 = *pqVar1;
  }
LAB_004028c1:
  (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
  super_QArrayDataPointer<QTimeZonePrivate::Data>.size = lVar11 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }